

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

bool __thiscall
ThreadedReplayer::enqueue_create_descriptor_set_layout
          (ThreadedReplayer *this,Hash index,VkDescriptorSetLayoutCreateInfo *create_info,
          VkDescriptorSetLayout *layout)

{
  mapped_type pVVar1;
  bool bVar2;
  VkResult VVar3;
  mapped_type *ppVVar4;
  long in_FS_OFFSET;
  StateCreatorInterface local_20;
  
  if (((this->per_thread_data).
       super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
       ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag &
      ~RESOURCE_SAMPLER) == RESOURCE_DESCRIPTOR_SET_LAYOUT) {
    local_20._vptr_StateCreatorInterface = (_func_int **)index;
    bVar2 = Fossilize::FeatureFilter::descriptor_set_layout_is_supported
                      (&((this->device)._M_t.
                         super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                         .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                        feature_filter,create_info);
    if (bVar2) {
      VVar3 = (*vkCreateDescriptorSetLayout)
                        (((this->device)._M_t.
                          super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                          .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                         device,create_info,(VkAllocationCallbacks *)0x0,layout);
      if (VVar3 == VK_SUCCESS) {
        pVVar1 = *layout;
        ppVVar4 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->layouts,(key_type *)&stack0xffffffffffffffe0);
        *ppVVar4 = pVVar1;
        return true;
      }
      enqueue_create_descriptor_set_layout((ThreadedReplayer *)&stack0xffffffffffffffe0);
    }
    else {
      enqueue_create_descriptor_set_layout((ThreadedReplayer *)&stack0xffffffffffffffe0);
    }
  }
  return false;
}

Assistant:

bool enqueue_create_descriptor_set_layout(Hash index, const VkDescriptorSetLayoutCreateInfo *create_info, VkDescriptorSetLayout *layout) override
	{
		auto &per_thread = get_per_thread_data();
		if (per_thread.expected_tag != RESOURCE_DESCRIPTOR_SET_LAYOUT &&
		    per_thread.expected_tag != RESOURCE_PIPELINE_LAYOUT)
		{
			return false;
		}

		if (!device->get_feature_filter().descriptor_set_layout_is_supported(create_info))
		{
			LOGW("Descriptor set layout %016" PRIx64 " is not supported. Skipping.\n", index);
			return false;
		}

		// Playback in-order.
		if (vkCreateDescriptorSetLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
		{
			LOGE("Creating descriptor set layout %016" PRIx64 " Failed!\n", index);
			return false;
		}
		layouts[index] = *layout;
		return true;
	}